

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

bool __thiscall sf::priv::WindowImpl::popEvent(WindowImpl *this,Event *event,bool block)

{
  bool bVar1;
  Time TVar2;
  reference pvVar3;
  byte in_DL;
  undefined8 *in_RSI;
  long *in_RDI;
  WindowImpl *in_stack_00000080;
  Int32 in_stack_ffffffffffffffcc;
  bool local_1;
  
  bVar1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::empty
                    ((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)
                     0x2f8459);
  if (bVar1) {
    processJoystickEvents(in_stack_00000080);
    processSensorEvents((WindowImpl *)event);
    (**(code **)(*in_RDI + 0x80))();
    if ((in_DL & 1) != 0) {
      while (bVar1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::
                     empty((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)
                           0x2f849b), bVar1) {
        TVar2 = milliseconds(in_stack_ffffffffffffffcc);
        sleep((uint)TVar2.m_microseconds);
        processJoystickEvents(in_stack_00000080);
        processSensorEvents((WindowImpl *)event);
        (**(code **)(*in_RDI + 0x80))();
      }
    }
  }
  local_1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::empty
                      ((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)
                       0x2f84f0);
  if (!local_1) {
    pvVar3 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::front
                       ((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)
                        0x2f8502);
    *in_RSI = *(undefined8 *)pvVar3;
    in_RSI[1] = *(undefined8 *)((long)&pvVar3->field_1 + 4);
    *(int *)(in_RSI + 2) = (pvVar3->field_1).mouseWheelScroll.y;
    std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::pop
              ((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)0x2f852c);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool WindowImpl::popEvent(Event& event, bool block)
{
    // If the event queue is empty, let's first check if new events are available from the OS
    if (m_events.empty())
    {
        // Get events from the system
        processJoystickEvents();
        processSensorEvents();
        processEvents();

        // In blocking mode, we must process events until one is triggered
        if (block)
        {
            // Here we use a manual wait loop instead of the optimized
            // wait-event provided by the OS, so that we don't skip joystick
            // events (which require polling)
            while (m_events.empty())
            {
                sleep(milliseconds(10));
                processJoystickEvents();
                processSensorEvents();
                processEvents();
            }
        }
    }

    // Pop the first event of the queue, if it is not empty
    if (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop();

        return true;
    }

    return false;
}